

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QDateTimeEdit::setMinimumDate(QDateTimeEdit *this,QDate min)

{
  bool bVar1;
  undefined4 uVar2;
  QDateTimeEditPrivate *this_00;
  qint64 in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QDateTimeEditPrivate *d;
  QDate *in_stack_ffffffffffffffa8;
  QDate *in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  QDateTimeEditPrivate *this_01;
  QTime time;
  QDateTime local_20 [8];
  QDate local_18;
  qint64 local_10;
  long local_8;
  
  time.mds = (int)((ulong)in_RDI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  this_00 = d_func((QDateTimeEdit *)0x5591cf);
  bVar1 = QDate::isValid((QDate *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0 & 0xffffff;
  if (bVar1) {
    QDate::QDate(&local_18,100,1,1);
    bVar1 = operator>=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffc0 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffc0);
  }
  if ((char)(in_stack_ffffffffffffffc0 >> 0x18) != '\0') {
    this_01 = this_00;
    uVar2 = ::QVariant::toTime();
    QDateTimeEditPrivate::dateTimeValue(this_00,(QDate)local_10,time);
    setMinimumDateTime((QDateTimeEdit *)this_01,
                       (QDateTime *)CONCAT44(uVar2,in_stack_ffffffffffffffc0));
    QDateTime::~QDateTime(local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateTimeEdit::setMinimumDate(QDate min)
{
    Q_D(QDateTimeEdit);
    if (min.isValid() && min >= QDATETIMEEDIT_DATE_MIN)
        setMinimumDateTime(d->dateTimeValue(min, d->minimum.toTime()));
}